

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

int nn_ws_match_token(char *token,char **subj,int case_insensitive,int ignore_leading_sp)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char *local_30;
  char *pos;
  int ignore_leading_sp_local;
  int case_insensitive_local;
  char **subj_local;
  char *token_local;
  
  bVar3 = false;
  if (token != (char *)0x0) {
    bVar3 = *subj != (char *)0x0;
  }
  if (!bVar3) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","token && *subj",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
            ,0x10f);
    fflush(_stderr);
    nn_err_abort();
  }
  local_30 = *subj;
  if (ignore_leading_sp != 0) {
    while( true ) {
      bVar3 = false;
      if (*local_30 == ' ') {
        bVar3 = *local_30 != '\0';
      }
      if (!bVar3) break;
      local_30 = local_30 + 1;
    }
  }
  subj_local = (char **)token;
  if (case_insensitive == 0) {
    while( true ) {
      bVar3 = false;
      if (*(char *)subj_local != '\0') {
        bVar3 = *local_30 != '\0';
      }
      if (!bVar3) break;
      if (*(char *)subj_local != *local_30) {
        return 0;
      }
      subj_local = (char **)((long)subj_local + 1);
      local_30 = local_30 + 1;
    }
  }
  else {
    while( true ) {
      bVar3 = false;
      if (*(char *)subj_local != '\0') {
        bVar3 = *local_30 != '\0';
      }
      if (!bVar3) break;
      iVar1 = tolower((int)*(char *)subj_local);
      iVar2 = tolower((int)*local_30);
      if (iVar1 != iVar2) {
        return 0;
      }
      subj_local = (char **)((long)subj_local + 1);
      local_30 = local_30 + 1;
    }
  }
  if ((*local_30 == '\0') && (*(char *)subj_local != '\0')) {
    return 0;
  }
  if (*(char *)subj_local == '\0') {
    *subj = local_30;
    return 1;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!*token",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
          ,0x12f);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_ws_match_token (const char* token, const char **subj,
    int case_insensitive, int ignore_leading_sp)
{
    const char *pos;

    nn_assert (token && *subj);

    pos = *subj;

    if (ignore_leading_sp) {
        while (*pos == '\x20' && *pos) {
            pos++;
        }
    }

    if (case_insensitive) {
        while (*token && *pos) {
            if (tolower (*token) != tolower (*pos))
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }
    else {
        while (*token && *pos) {
            if (*token != *pos)
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }

    /*  Encountered end of subject before matching completed. */
    if (!*pos && *token)
        return NN_WS_HANDSHAKE_NOMATCH;

    /*  Entire token has been matched. */
    nn_assert (!*token);

    /*  On success, advance subject position. */
    *subj = pos;

    return NN_WS_HANDSHAKE_MATCH;
}